

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::updateLineEditGeometry(QComboBoxPrivate *this)

{
  long lVar1;
  QWidget *this_00;
  char cVar2;
  LayoutDirection direction;
  QStyle *pQVar3;
  QSize QVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QSize local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit != (QLineEdit *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    memset(&opt,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&opt);
    (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&opt);
    pQVar3 = QWidget::style(this_00);
    QVar5 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,1,&opt,2,this_00);
    local_d8 = (undefined1  [16])QVar5;
    cVar2 = QPersistentModelIndex::isValid();
    if (cVar2 != '\0') {
      QComboBox::currentIndex((QComboBox *)this_00);
      QComboBox::itemIcon((QComboBox *)local_e8,(int)this_00);
      cVar2 = QIcon::isNull();
      QIcon::~QIcon((QIcon *)local_e8);
      if (cVar2 == '\0') {
        local_e8._0_8_ = local_d8._0_8_;
        local_e8._8_8_ = local_d8._8_8_;
        QVar4 = QComboBox::iconSize((QComboBox *)this_00);
        direction = QWidget::layoutDirection(this_00);
        local_f0.wd.m_i = (QVar5.x2.m_i.m_i - (QVar4.wd.m_i.m_i + QVar5.x1.m_i.m_i)) + -3;
        local_f0.ht.m_i = (QVar5.y2.m_i.m_i - QVar5.y1.m_i) + 1;
        local_d8 = (undefined1  [16])
                   QStyle::alignedRect(direction,(Alignment)0x2,&local_f0,(QRect *)local_e8);
      }
    }
    QWidget::setGeometry(&this->lineEdit->super_QWidget,(QRect *)local_d8);
    QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::updateLineEditGeometry()
{
    if (!lineEdit)
        return;

    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    QRect editRect = q->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                QStyle::SC_ComboBoxEditField, q);
    if (currentIndex.isValid() && !q->itemIcon(q->currentIndex()).isNull()) {
        QRect comboRect(editRect);
        editRect.setWidth(editRect.width() - q->iconSize().width() - 4);
        editRect = QStyle::alignedRect(q->layoutDirection(), Qt::AlignRight,
                                       editRect.size(), comboRect);
    }
    lineEdit->setGeometry(editRect);
}